

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O3

int lj_opt_fwd_wasnonnil(jit_State *J,IROpT loadop,IRRef xref)

{
  ushort uVar1;
  ushort uVar2;
  IRIns *pIVar3;
  ulong uVar4;
  undefined6 in_register_00000032;
  IRIns *pIVar5;
  
  uVar4 = CONCAT62(in_register_00000032,loadop) & 0xffffffff;
  uVar1 = J->chain[uVar4 + 8];
  if (xref < uVar1) {
    pIVar3 = (J->cur).ir;
    do {
      pIVar5 = pIVar3 + uVar1;
      if ((pIVar5->field_0).op1 == xref) goto LAB_00157dc7;
      if (((pIVar5->field_1).t.irt & 0x1f) == 0) {
        uVar1 = *(ushort *)((long)pIVar3 + (ulong)(pIVar5->field_0).op1 * 8 + 2);
        uVar2 = *(ushort *)((long)pIVar3 + (ulong)xref * 8 + 2);
        if ((loadop == 0x42) ||
           (((*(byte *)((long)pIVar3 + (ulong)uVar2 * 8 + 4) ^
             *(byte *)((long)pIVar3 + (ulong)uVar1 * 8 + 4)) & 0x1f) == 0)) {
          if (uVar1 == uVar2) {
            return 0;
          }
          if ((short)(uVar1 | uVar2) < 0) {
            return 0;
          }
        }
      }
      uVar1 = (pIVar5->field_0).prev;
    } while ((ushort)xref < uVar1);
  }
  uVar1 = J->chain[uVar4];
  if (xref < uVar1) {
    do {
      pIVar5 = (J->cur).ir + uVar1;
      if ((pIVar5->field_0).op1 == xref) {
LAB_00157dc7:
        return (uint)(((pIVar5->field_1).t.irt & 0x1f) != 0);
      }
      uVar1 = (pIVar5->field_0).prev;
    } while ((ushort)xref < uVar1);
  }
  return 0;
}

Assistant:

int lj_opt_fwd_wasnonnil(jit_State *J, IROpT loadop, IRRef xref)
{
  /* First check stores. */
  IRRef ref = J->chain[loadop+IRDELTA_L2S];
  while (ref > xref) {
    IRIns *store = IR(ref);
    if (store->op1 == xref) {  /* Same xREF. */
      /* A nil store MAY alias, but a non-nil store MUST alias. */
      return !irt_isnil(store->t);
    } else if (irt_isnil(store->t)) {  /* Must check any nil store. */
      IRRef skref = IR(store->op1)->op2;
      IRRef xkref = IR(xref)->op2;
      /* Same key type MAY alias. Need ALOAD check due to multiple int types. */
      if (loadop == IR_ALOAD || irt_sametype(IR(skref)->t, IR(xkref)->t)) {
	if (skref == xkref || !irref_isk(skref) || !irref_isk(xkref))
	  return 0;  /* A nil store with same const key or var key MAY alias. */
	/* Different const keys CANNOT alias. */
      }  /* Different key types CANNOT alias. */
    }  /* Other non-nil stores MAY alias. */
    ref = store->prev;
  }

  /* Check loads since nothing could be derived from stores. */
  ref = J->chain[loadop];
  while (ref > xref) {
    IRIns *load = IR(ref);
    if (load->op1 == xref) {  /* Same xREF. */
      /* A nil load MAY alias, but a non-nil load MUST alias. */
      return !irt_isnil(load->t);
    }  /* Other non-nil loads MAY alias. */
    ref = load->prev;
  }
  return 0;  /* Nothing derived at all, previous value MAY be nil. */
}